

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::is3DTrilinearFilterResultValid
               (LookupPrecision *prec,ColorQuad *quad00,ColorQuad *quad01,ColorQuad *quad10,
               ColorQuad *quad11,Vec2 *xBounds0,Vec2 *yBounds0,Vec2 *zBounds0,Vec2 *xBounds1,
               Vec2 *yBounds1,Vec2 *zBounds1,Vec2 *wBounds,float searchStep,Vec4 *result)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  Vector<float,_4> local_394;
  Vector<float,_4> local_384;
  undefined1 local_374 [8];
  Vec4 cz1;
  float c1;
  float z1;
  Vector<float,_4> local_34c;
  Vector<float,_4> local_33c;
  Vector<float,_4> local_32c;
  Vector<float,_4> local_31c;
  Vector<float,_4> local_30c;
  Vector<float,_4> local_2fc;
  Vector<float,_4> local_2ec;
  Vector<float,_4> local_2dc;
  Vector<float,_4> local_2cc;
  undefined1 local_2bc [8];
  Vec4 c11;
  Vector<float,_4> local_29c;
  Vector<float,_4> local_28c;
  Vector<float,_4> local_27c;
  Vector<float,_4> local_26c;
  Vector<float,_4> local_25c;
  Vector<float,_4> local_24c;
  Vector<float,_4> local_23c;
  Vector<float,_4> local_22c;
  Vector<float,_4> local_21c;
  undefined1 local_20c [8];
  Vec4 c10;
  float b1;
  float a1;
  float y1;
  float x1;
  Vector<float,_4> local_1dc;
  undefined1 local_1cc [8];
  Vec4 cz0;
  float c0;
  float z0;
  Vector<float,_4> local_1a4;
  Vector<float,_4> local_194;
  Vector<float,_4> local_184;
  Vector<float,_4> local_174;
  Vector<float,_4> local_164;
  Vector<float,_4> local_154;
  Vector<float,_4> local_144;
  Vector<float,_4> local_134;
  Vector<float,_4> local_124;
  undefined1 local_114 [8];
  Vec4 c01;
  Vector<float,_4> local_f4;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  Vector<float,_4> local_c4;
  Vector<float,_4> local_b4;
  Vector<float,_4> local_a4;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  undefined1 local_64 [8];
  Vec4 c00;
  float b0;
  float a0;
  float y0;
  float x0;
  float searchStep_local;
  Vec2 *xBounds0_local;
  ColorQuad *quad11_local;
  ColorQuad *quad10_local;
  ColorQuad *quad01_local;
  ColorQuad *quad00_local;
  LookupPrecision *prec_local;
  
  bVar2 = isInColorBounds(prec,quad00,quad01,quad10,quad11,result);
  if (bVar2) {
    for (a0 = Vector<float,_2>::x(xBounds0); fVar3 = Vector<float,_2>::y(xBounds0),
        a0 < fVar3 + searchStep; a0 = searchStep + a0) {
      for (b0 = Vector<float,_2>::x(yBounds0); fVar3 = Vector<float,_2>::y(yBounds0),
          b0 < fVar3 + searchStep; b0 = searchStep + b0) {
        fVar3 = Vector<float,_2>::y(xBounds0);
        c00.m_data[3] = de::min<float>(a0,fVar3);
        fVar3 = Vector<float,_2>::y(yBounds0);
        c00.m_data[2] = de::min<float>(b0,fVar3);
        operator*((tcu *)&local_a4,&quad00->p00,1.0 - c00.m_data[3]);
        operator*((tcu *)&local_94,&local_a4,1.0 - c00.m_data[2]);
        operator*((tcu *)&local_c4,&quad00->p10,c00.m_data[3]);
        operator*((tcu *)&local_b4,&local_c4,1.0 - c00.m_data[2]);
        operator+((tcu *)&local_84,&local_94,&local_b4);
        operator*((tcu *)&local_e4,&quad00->p01,1.0 - c00.m_data[3]);
        operator*((tcu *)&local_d4,&local_e4,c00.m_data[2]);
        operator+((tcu *)&local_74,&local_84,&local_d4);
        operator*((tcu *)(c01.m_data + 2),&quad00->p11,c00.m_data[3]);
        operator*((tcu *)&local_f4,(Vector<float,_4> *)(c01.m_data + 2),c00.m_data[2]);
        operator+((tcu *)local_64,&local_74,&local_f4);
        operator*((tcu *)&local_154,&quad01->p00,1.0 - c00.m_data[3]);
        operator*((tcu *)&local_144,&local_154,1.0 - c00.m_data[2]);
        operator*((tcu *)&local_174,&quad01->p10,c00.m_data[3]);
        operator*((tcu *)&local_164,&local_174,1.0 - c00.m_data[2]);
        operator+((tcu *)&local_134,&local_144,&local_164);
        operator*((tcu *)&local_194,&quad01->p01,1.0 - c00.m_data[3]);
        operator*((tcu *)&local_184,&local_194,c00.m_data[2]);
        operator+((tcu *)&local_124,&local_134,&local_184);
        operator*((tcu *)&c0,&quad01->p11,c00.m_data[3]);
        operator*((tcu *)&local_1a4,(Vector<float,_4> *)&c0,c00.m_data[2]);
        operator+((tcu *)local_114,&local_124,&local_1a4);
        for (cz0.m_data[3] = Vector<float,_2>::x(zBounds0); fVar3 = cz0.m_data[3],
            fVar4 = Vector<float,_2>::y(zBounds0), fVar1 = cz0.m_data[3], fVar3 < fVar4 + searchStep
            ; cz0.m_data[3] = searchStep + cz0.m_data[3]) {
          fVar3 = Vector<float,_2>::y(zBounds0);
          cz0.m_data[2] = de::min<float>(fVar1,fVar3);
          operator*((tcu *)&local_1dc,(Vector<float,_4> *)local_64,1.0 - cz0.m_data[2]);
          operator*((tcu *)&y1,(Vector<float,_4> *)local_114,cz0.m_data[2]);
          operator+((tcu *)local_1cc,&local_1dc,(Vector<float,_4> *)&y1);
          for (a1 = Vector<float,_2>::x(xBounds1); fVar3 = Vector<float,_2>::y(xBounds1),
              a1 < fVar3 + searchStep; a1 = searchStep + a1) {
            for (b1 = Vector<float,_2>::x(yBounds1); fVar3 = Vector<float,_2>::y(yBounds1),
                b1 < fVar3 + searchStep; b1 = searchStep + b1) {
              fVar3 = Vector<float,_2>::y(xBounds1);
              c10.m_data[3] = de::min<float>(a1,fVar3);
              fVar3 = Vector<float,_2>::y(yBounds1);
              c10.m_data[2] = de::min<float>(b1,fVar3);
              operator*((tcu *)&local_24c,&quad10->p00,1.0 - c10.m_data[3]);
              operator*((tcu *)&local_23c,&local_24c,1.0 - c10.m_data[2]);
              operator*((tcu *)&local_26c,&quad10->p10,c10.m_data[3]);
              operator*((tcu *)&local_25c,&local_26c,1.0 - c10.m_data[2]);
              operator+((tcu *)&local_22c,&local_23c,&local_25c);
              operator*((tcu *)&local_28c,&quad10->p01,1.0 - c10.m_data[3]);
              operator*((tcu *)&local_27c,&local_28c,c10.m_data[2]);
              operator+((tcu *)&local_21c,&local_22c,&local_27c);
              operator*((tcu *)(c11.m_data + 2),&quad10->p11,c10.m_data[3]);
              operator*((tcu *)&local_29c,(Vector<float,_4> *)(c11.m_data + 2),c10.m_data[2]);
              operator+((tcu *)local_20c,&local_21c,&local_29c);
              operator*((tcu *)&local_2fc,&quad11->p00,1.0 - c10.m_data[3]);
              operator*((tcu *)&local_2ec,&local_2fc,1.0 - c10.m_data[2]);
              operator*((tcu *)&local_31c,&quad11->p10,c10.m_data[3]);
              operator*((tcu *)&local_30c,&local_31c,1.0 - c10.m_data[2]);
              operator+((tcu *)&local_2dc,&local_2ec,&local_30c);
              operator*((tcu *)&local_33c,&quad11->p01,1.0 - c10.m_data[3]);
              operator*((tcu *)&local_32c,&local_33c,c10.m_data[2]);
              operator+((tcu *)&local_2cc,&local_2dc,&local_32c);
              operator*((tcu *)&c1,&quad11->p11,c10.m_data[3]);
              operator*((tcu *)&local_34c,(Vector<float,_4> *)&c1,c10.m_data[2]);
              operator+((tcu *)local_2bc,&local_2cc,&local_34c);
              for (cz1.m_data[3] = Vector<float,_2>::x(zBounds1); fVar3 = cz1.m_data[3],
                  fVar4 = Vector<float,_2>::y(zBounds1), fVar1 = cz1.m_data[3],
                  fVar3 < fVar4 + searchStep; cz1.m_data[3] = searchStep + cz1.m_data[3]) {
                fVar3 = Vector<float,_2>::y(zBounds1);
                cz1.m_data[2] = de::min<float>(fVar1,fVar3);
                operator*((tcu *)&local_384,(Vector<float,_4> *)local_20c,1.0 - cz1.m_data[2]);
                operator*((tcu *)&local_394,(Vector<float,_4> *)local_2bc,cz1.m_data[2]);
                operator+((tcu *)local_374,&local_384,&local_394);
                bVar2 = isLinearRangeValid(prec,(Vec4 *)local_1cc,(Vec4 *)local_374,wBounds,result);
                if (bVar2) {
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool is3DTrilinearFilterResultValid (const LookupPrecision&	prec,
											const ColorQuad&		quad00,
											const ColorQuad&		quad01,
											const ColorQuad&		quad10,
											const ColorQuad&		quad11,
											const Vec2&				xBounds0,
											const Vec2&				yBounds0,
											const Vec2&				zBounds0,
											const Vec2&				xBounds1,
											const Vec2&				yBounds1,
											const Vec2&				zBounds1,
											const Vec2&				wBounds,
											const float				searchStep,
											const Vec4&				result)
{
	DE_ASSERT(xBounds0.x() <= xBounds0.y());
	DE_ASSERT(yBounds0.x() <= yBounds0.y());
	DE_ASSERT(zBounds0.x() <= zBounds0.y());
	DE_ASSERT(xBounds1.x() <= xBounds1.y());
	DE_ASSERT(yBounds1.x() <= yBounds1.y());
	DE_ASSERT(zBounds1.x() <= zBounds1.y());
	DE_ASSERT(xBounds0.x() + searchStep > xBounds0.x()); // step is not effectively 0
	DE_ASSERT(xBounds0.y() + searchStep > xBounds0.y());
	DE_ASSERT(yBounds0.x() + searchStep > yBounds0.x());
	DE_ASSERT(yBounds0.y() + searchStep > yBounds0.y());
	DE_ASSERT(zBounds0.x() + searchStep > zBounds0.x());
	DE_ASSERT(zBounds0.y() + searchStep > zBounds0.y());
	DE_ASSERT(xBounds1.x() + searchStep > xBounds1.x());
	DE_ASSERT(xBounds1.y() + searchStep > xBounds1.y());
	DE_ASSERT(yBounds1.x() + searchStep > yBounds1.x());
	DE_ASSERT(yBounds1.y() + searchStep > yBounds1.y());
	DE_ASSERT(zBounds1.x() + searchStep > zBounds1.x());
	DE_ASSERT(zBounds1.y() + searchStep > zBounds1.y());

	if (!isInColorBounds(prec, quad00, quad01, quad10, quad11, result))
		return false;

	for (float x0 = xBounds0.x(); x0 < xBounds0.y()+searchStep; x0 += searchStep)
	{
		for (float y0 = yBounds0.x(); y0 < yBounds0.y()+searchStep; y0 += searchStep)
		{
			const float		a0	= de::min(x0, xBounds0.y());
			const float		b0	= de::min(y0, yBounds0.y());
			const Vec4		c00	= quad00.p00*(1.0f-a0)*(1.0f-b0) + quad00.p10*a0*(1.0f-b0) + quad00.p01*(1.0f-a0)*b0 + quad00.p11*a0*b0;
			const Vec4		c01	= quad01.p00*(1.0f-a0)*(1.0f-b0) + quad01.p10*a0*(1.0f-b0) + quad01.p01*(1.0f-a0)*b0 + quad01.p11*a0*b0;

			for (float z0 = zBounds0.x(); z0 < zBounds0.y()+searchStep; z0 += searchStep)
			{
				const float		c0	= de::min(z0, zBounds0.y());
				const Vec4		cz0	= c00*(1.0f-c0) + c01*c0;

				for (float x1 = xBounds1.x(); x1 < xBounds1.y()+searchStep; x1 += searchStep)
				{
					for (float y1 = yBounds1.x(); y1 < yBounds1.y()+searchStep; y1 += searchStep)
					{
						const float		a1	= de::min(x1, xBounds1.y());
						const float		b1	= de::min(y1, yBounds1.y());
						const Vec4		c10	= quad10.p00*(1.0f-a1)*(1.0f-b1) + quad10.p10*a1*(1.0f-b1) + quad10.p01*(1.0f-a1)*b1 + quad10.p11*a1*b1;
						const Vec4		c11	= quad11.p00*(1.0f-a1)*(1.0f-b1) + quad11.p10*a1*(1.0f-b1) + quad11.p01*(1.0f-a1)*b1 + quad11.p11*a1*b1;

						for (float z1 = zBounds1.x(); z1 < zBounds1.y()+searchStep; z1 += searchStep)
						{
							const float		c1	= de::min(z1, zBounds1.y());
							const Vec4		cz1	= c10*(1.0f - c1) + c11*c1;

							if (isLinearRangeValid(prec, cz0, cz1, wBounds, result))
								return true;
						}
					}
				}
			}
		}
	}

	return false;
}